

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O2

CSemaphoreGrant * __thiscall
CSemaphoreGrant::operator=(CSemaphoreGrant *this,CSemaphoreGrant *other)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Release(this);
  this->sem = other->sem;
  this->fHaveGrant = other->fHaveGrant;
  other->fHaveGrant = false;
  other->sem = (CSemaphore *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSemaphoreGrant& operator=(CSemaphoreGrant&& other) noexcept
    {
        Release();
        sem = other.sem;
        fHaveGrant = other.fHaveGrant;
        other.fHaveGrant = false;
        other.sem = nullptr;
        return *this;
    }